

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

bool __thiscall
crnlib::dxt_hc::compress
          (dxt_hc *this,color_quad_u8 (*blocks) [16],
          vector<crnlib::dxt_hc::endpoint_indices_details> *endpoint_indices,
          vector<crnlib::dxt_hc::selector_indices_details> *selector_indices,
          vector<unsigned_int> *color_endpoints,vector<unsigned_int> *alpha_endpoints,
          vector<unsigned_int> *color_selectors,vector<unsigned_long_long> *alpha_selectors,
          params *p)

{
  undefined8 uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  crn_thread_id_t cVar5;
  float *pfVar6;
  tile_details *this_00;
  color_cluster *pcVar7;
  unsigned_short *puVar8;
  value_type *pvVar9;
  alpha_cluster *paVar10;
  bool *pbVar11;
  value_type *pvVar12;
  endpoint_indices_details *peVar13;
  selector_indices_details *psVar14;
  vector<crnlib::dxt_hc::selector_indices_details> *in_RCX;
  vector<crnlib::dxt_hc::endpoint_indices_details> *in_RDX;
  undefined8 in_RSI;
  vector<crnlib::dxt_hc::tile_details> *in_RDI;
  vector<unsigned_int> *in_R8;
  vector<unsigned_int> *in_R9;
  bool bVar15;
  bool bVar16;
  float fVar17;
  vector<unsigned_int> *in_stack_00000008;
  vector<unsigned_long_long> *in_stack_00000010;
  void *in_stack_00000018;
  uint16 selector_index;
  uint16 endpoint_index;
  uint c_1;
  bool diag_match;
  bool left_match;
  bool top_match;
  uint bx;
  uint b_1;
  uint by;
  uint block_width;
  uint end_block;
  uint first_block;
  uint level_2;
  insert_result insert_result_3;
  uint i_5;
  hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  alpha_selectors_map;
  vector<unsigned_short> alpha_selectors_remap;
  insert_result insert_result_2;
  uint i_4;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  color_selectors_map;
  vector<unsigned_short> color_selectors_remap;
  insert_result insert_result_1;
  uint32 endpoint_1;
  uint i_3;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  alpha_endpoints_map;
  vector<unsigned_short> alpha_endpoints_remap;
  insert_result insert_result;
  uint32 endpoint;
  uint i_2;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  color_endpoints_map;
  vector<unsigned_short> color_endpoints_remap;
  uint t;
  uint i_1;
  uint bEnd;
  uint b;
  float weight;
  uint level_1;
  uint c;
  uint i;
  uint e_1;
  uint e;
  float adaptive_tile_color_psnr_derating;
  uint level;
  uint tile_derating [8];
  undefined4 in_stack_fffffffffffffb18;
  uint in_stack_fffffffffffffb1c;
  dxt_hc *in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  uint in_stack_fffffffffffffb2c;
  undefined4 in_stack_fffffffffffffb30;
  uint8 uVar18;
  undefined4 in_stack_fffffffffffffb34;
  hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  *in_stack_fffffffffffffb38;
  undefined6 in_stack_fffffffffffffb40;
  undefined2 in_stack_fffffffffffffb46;
  unsigned_short uVar19;
  undefined8 in_stack_fffffffffffffb48;
  uint new_capacity;
  dxt_hc *in_stack_fffffffffffffb50;
  task_pool *in_stack_fffffffffffffb58;
  vector<unsigned_short> *local_498;
  vector<unsigned_short> *local_430;
  bool local_423;
  undefined4 local_248;
  byte local_242;
  bool local_241;
  bool local_235;
  uint local_230;
  uint local_228;
  uint local_224;
  int local_220;
  uint local_210;
  byte local_1f8;
  uint local_1ec;
  vector<unsigned_short> local_1c8;
  uint local_1b4;
  byte local_1a0;
  uint local_194;
  dxt_hc *in_stack_fffffffffffffe70;
  vector<unsigned_short> local_170;
  uint local_15c;
  byte local_148;
  uint local_140;
  uint local_13c;
  dxt_hc *in_stack_fffffffffffffef0;
  byte local_f0;
  uint local_e0;
  vector<unsigned_short> local_b0;
  uint local_9c;
  code *local_98;
  undefined8 local_90;
  uint local_84;
  uint local_80;
  uint local_7c;
  float local_78;
  uint local_74;
  uint uVar20;
  uint uVar21;
  uint local_68;
  uint local_64;
  float local_60;
  uint local_5c;
  uint local_58 [8];
  vector<unsigned_int> *local_38;
  vector<unsigned_int> *local_30;
  vector<crnlib::dxt_hc::selector_indices_details> *local_28;
  vector<crnlib::dxt_hc::endpoint_indices_details> *local_20;
  undefined8 local_18;
  byte local_1;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  clear(in_stack_fffffffffffffb20);
  local_235 = true;
  if ((((*(int *)((long)in_stack_00000018 + 0x10c) != 7) &&
       (local_235 = true, *(int *)((long)in_stack_00000018 + 0x10c) != 8)) &&
      (local_235 = true, *(int *)((long)in_stack_00000018 + 0x10c) != 9)) &&
     (local_235 = true, *(int *)((long)in_stack_00000018 + 0x10c) != 10)) {
    local_235 = *(int *)((long)in_stack_00000018 + 0x10c) == 0xb;
  }
  *(bool *)((long)&in_RDI[0x86].m_p + 5) = local_235;
  local_241 = true;
  if ((*(int *)((long)in_stack_00000018 + 0x10c) != 7) &&
     (local_241 = true, *(int *)((long)in_stack_00000018 + 0x10c) != 8)) {
    local_241 = *(int *)((long)in_stack_00000018 + 0x10c) == 9;
  }
  *(bool *)((long)&in_RDI[0x86].m_p + 6) = local_241;
  local_242 = 1;
  if ((*(int *)((long)in_stack_00000018 + 0x10c) != 0) &&
     (local_242 = 1, *(int *)((long)in_stack_00000018 + 0x10c) != 3)) {
    local_242 = *(byte *)((long)&in_RDI[0x86].m_p + 5);
  }
  *(byte *)((long)&in_RDI[0x86].m_p + 4) = local_242 & 1;
  if ((((*(int *)((long)in_stack_00000018 + 0x10c) == 3) ||
       (*(int *)((long)in_stack_00000018 + 0x10c) == 4)) ||
      (*(int *)((long)in_stack_00000018 + 0x10c) == 9)) ||
     (*(int *)((long)in_stack_00000018 + 0x10c) == 0xb)) {
    local_248 = 1;
  }
  else {
    bVar15 = true;
    if (*(int *)((long)in_stack_00000018 + 0x10c) != 5) {
      bVar15 = *(int *)((long)in_stack_00000018 + 0x10c) == 6;
    }
    local_248 = 0;
    if (bVar15) {
      local_248 = 2;
    }
  }
  *(undefined4 *)&in_RDI[0x86].m_p = local_248;
  if ((((ulong)in_RDI[0x86].m_p & 0x100000000) == 0) && (*(int *)&in_RDI[0x86].m_p == 0)) {
    local_1 = 0;
  }
  else {
    in_RDI[99].m_size = (undefined4)local_18;
    in_RDI[99].m_capacity = local_18._4_4_;
    cVar5 = crn_get_current_thread_id();
    in_RDI[0x88].m_size = (int)cVar5;
    in_RDI[0x88].m_capacity = (int)(cVar5 >> 0x20);
    uVar1 = *(undefined8 *)((long)in_stack_00000018 + 0x138);
    in_RDI[0x89].m_size = (int)uVar1;
    in_RDI[0x89].m_capacity = (int)((ulong)uVar1 >> 0x20);
    memcpy(&in_RDI[0x70].m_size,in_stack_00000018,0x158);
    local_58[0] = 0;
    local_58[1] = 1;
    local_58[2] = 1;
    local_58[3] = 2;
    local_58[4] = 2;
    local_58[5] = 2;
    local_58[6] = 2;
    local_58[7] = 3;
    for (local_5c = 0; local_5c < *(uint *)((long)in_stack_00000018 + 4); local_5c = local_5c + 1) {
      local_60 = *(float *)((long)in_stack_00000018 + 0x124);
      if ((local_5c != 0) && (0.25 < local_60)) {
        fVar17 = powf(3.0,(float)local_5c);
        local_60 = math::maximum<float>(0.25,local_60 / fVar17);
      }
      for (local_64 = 0; local_64 < 8; local_64 = local_64 + 1) {
        fVar17 = math::lerp<float,float>(0.0,local_60,(float)local_58[local_64] / 3.0);
        *(float *)((long)&in_RDI[(ulong)local_5c * 2 + 1].m_p + (ulong)local_64 * 4 + 4) = fVar17;
      }
    }
    for (local_68 = 0; local_68 < 8; local_68 = local_68 + 1) {
      fVar17 = math::lerp<float,float>
                         (0.0,*(float *)&in_RDI[0x83].m_p,(float)local_58[local_68] / 3.0);
      *(float *)((long)&in_RDI[0x21].m_p + (ulong)local_68 * 4 + 4) = fVar17;
    }
    for (uVar21 = 0; uVar21 < 0x100; uVar21 = uVar21 + 1) {
      *(float *)((long)&in_RDI[0x23].m_p + (ulong)uVar21 * 4 + 4) = ((float)uVar21 * 1.0) / 255.0;
    }
    *(uint *)&in_RDI[100].m_p = in_RDI[0x70].m_size;
    vector<float>::resize
              ((vector<float> *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb2c,SUB41((uint)in_stack_fffffffffffffb28 >> 0x18,0));
    vector<unsigned_char>::resize
              ((vector<unsigned_char> *)
               CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb2c,SUB41((uint)in_stack_fffffffffffffb28 >> 0x18,0));
    for (uVar20 = 0; bVar15 = SUB41((uint)in_stack_fffffffffffffb28 >> 0x18,0), uVar20 < 3;
        uVar20 = uVar20 + 1) {
      vector<unsigned_long_long>::resize
                ((vector<unsigned_long_long> *)
                 CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 in_stack_fffffffffffffb2c,bVar15);
    }
    vector<unsigned_int>::resize
              ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30)
               ,in_stack_fffffffffffffb2c,bVar15);
    vector<crnlib::dxt_hc::endpoint_indices_details>::resize
              ((vector<crnlib::dxt_hc::endpoint_indices_details> *)
               CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb2c,SUB41((uint)in_stack_fffffffffffffb28 >> 0x18,0));
    vector<crnlib::dxt_hc::selector_indices_details>::resize
              ((vector<crnlib::dxt_hc::selector_indices_details> *)
               CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb2c,SUB41((uint)in_stack_fffffffffffffb28 >> 0x18,0));
    vector<crnlib::dxt_hc::tile_details>::resize
              ((vector<crnlib::dxt_hc::tile_details> *)
               CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb2c,SUB41((uint)in_stack_fffffffffffffb28 >> 0x18,0));
    for (local_74 = 0; local_74 < *(uint *)((long)in_stack_00000018 + 4); local_74 = local_74 + 1) {
      local_78 = *(float *)((long)in_stack_00000018 + (ulong)local_74 * 0x10 + 0x18);
      local_7c = *(uint *)((long)in_stack_00000018 + (ulong)local_74 * 0x10 + 0xc);
      local_80 = local_7c + *(int *)((long)in_stack_00000018 + (ulong)local_74 * 0x10 + 0x10);
      for (; fVar17 = local_78, local_7c < local_80; local_7c = local_7c + 1) {
        pfVar6 = vector<float>::operator[]((vector<float> *)&in_RDI[100].m_size,local_7c);
        *pfVar6 = fVar17;
      }
    }
    for (local_84 = 0; uVar2 = local_84,
        uVar4 = task_pool::get_num_threads(*(task_pool **)&in_RDI[0x89].m_size), uVar2 <= uVar4;
        local_84 = local_84 + 1) {
      local_98 = determine_tiles_task;
      if (((ulong)in_RDI[0x86].m_p & 0x1000000000000) != 0) {
        local_98 = determine_tiles_task_etc;
      }
      local_90 = 0;
      task_pool::queue_object_task<crnlib::dxt_hc,void(crnlib::dxt_hc::*)(unsigned_long_long,void*)>
                (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                 CONCAT26(in_stack_fffffffffffffb46,in_stack_fffffffffffffb40),
                 (uint64)in_stack_fffffffffffffb38,
                 (void *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    }
    task_pool::join((task_pool *)CONCAT26(in_stack_fffffffffffffb46,in_stack_fffffffffffffb40));
    *(undefined4 *)&in_RDI[1].m_p = 0;
    for (local_9c = 0; uVar2 = local_9c, uVar4 = vector<crnlib::dxt_hc::tile_details>::size(in_RDI),
        uVar2 < uVar4; local_9c = local_9c + 1) {
      this_00 = vector<crnlib::dxt_hc::tile_details>::operator[](in_RDI,local_9c);
      uVar4 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&this_00->pixels);
      if (uVar4 != 0) {
        *(int *)&in_RDI[1].m_p = *(int *)&in_RDI[1].m_p + 1;
      }
    }
    if (((ulong)in_RDI[0x86].m_p & 0x100000000) != 0) {
      determine_color_endpoints(in_stack_fffffffffffffef0);
    }
    if (*(int *)&in_RDI[0x86].m_p != 0) {
      determine_alpha_endpoints(in_stack_fffffffffffffe70);
    }
    if (((ulong)in_RDI[0x86].m_p & 0x100000000) != 0) {
      create_color_selector_codebook((dxt_hc *)CONCAT44(uVar21,uVar20));
    }
    if (*(int *)&in_RDI[0x86].m_p != 0) {
      create_alpha_selector_codebook((dxt_hc *)CONCAT44(uVar21,uVar20));
    }
    vector<unsigned_int>::size(local_30);
    vector<crnlib::dxt_hc::color_cluster>::size
              ((vector<crnlib::dxt_hc::color_cluster> *)&in_RDI[0x86].m_size);
    vector<unsigned_int>::reserve
              ((vector<unsigned_int> *)in_stack_fffffffffffffb50,
               (uint)((ulong)in_stack_fffffffffffffb48 >> 0x20));
    vector<crnlib::dxt_hc::color_cluster>::size
              ((vector<crnlib::dxt_hc::color_cluster> *)&in_RDI[0x86].m_size);
    vector<unsigned_short>::vector
              ((vector<unsigned_short> *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::hash_map((hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                *)in_stack_fffffffffffffb20);
    for (local_e0 = 0;
        uVar4 = vector<crnlib::dxt_hc::color_cluster>::size
                          ((vector<crnlib::dxt_hc::color_cluster> *)&in_RDI[0x86].m_size),
        local_e0 < uVar4; local_e0 = local_e0 + 1) {
      pcVar7 = vector<crnlib::dxt_hc::color_cluster>::operator[]
                         ((vector<crnlib::dxt_hc::color_cluster> *)&in_RDI[0x86].m_size,local_e0);
      uVar4 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&pcVar7->pixels);
      if (uVar4 != 0) {
        if (((ulong)in_RDI[0x86].m_p & 0x10000000000) == 0) {
          pcVar7 = vector<crnlib::dxt_hc::color_cluster>::operator[]
                             ((vector<crnlib::dxt_hc::color_cluster> *)&in_RDI[0x86].m_size,local_e0
                             );
          uVar4 = pcVar7->first_endpoint;
          pcVar7 = vector<crnlib::dxt_hc::color_cluster>::operator[]
                             ((vector<crnlib::dxt_hc::color_cluster> *)&in_RDI[0x86].m_size,local_e0
                             );
          dxt1_block::pack_endpoints(uVar4,pcVar7->second_endpoint);
        }
        else {
          vector<crnlib::dxt_hc::color_cluster>::operator[]
                    ((vector<crnlib::dxt_hc::color_cluster> *)&in_RDI[0x86].m_size,local_e0);
        }
        vector<unsigned_int>::size(local_30);
        hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        ::insert((hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                  *)in_stack_fffffffffffffb38,
                 (uint *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 (uint *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        if ((local_f0 & 1) == 0) {
          pvVar9 = hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                   ::iterator::operator->((iterator *)0x1ea3ee);
          uVar21 = pvVar9->second;
          puVar8 = vector<unsigned_short>::operator[](&local_b0,local_e0);
          *puVar8 = (unsigned_short)uVar21;
        }
        else {
          uVar4 = vector<unsigned_int>::size(local_30);
          puVar8 = vector<unsigned_short>::operator[](&local_b0,local_e0);
          *puVar8 = (unsigned_short)uVar4;
          vector<unsigned_int>::push_back
                    ((vector<unsigned_int> *)in_stack_fffffffffffffb20,
                     (uint *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
        }
      }
    }
    vector<unsigned_int>::size(local_38);
    vector<crnlib::dxt_hc::alpha_cluster>::size
              ((vector<crnlib::dxt_hc::alpha_cluster> *)&in_RDI[0x87].m_size);
    vector<unsigned_int>::reserve
              ((vector<unsigned_int> *)in_stack_fffffffffffffb50,
               (uint)((ulong)in_stack_fffffffffffffb48 >> 0x20));
    vector<crnlib::dxt_hc::alpha_cluster>::size
              ((vector<crnlib::dxt_hc::alpha_cluster> *)&in_RDI[0x87].m_size);
    vector<unsigned_short>::vector
              ((vector<unsigned_short> *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::hash_map((hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                *)in_stack_fffffffffffffb20);
    for (local_13c = 0; uVar21 = local_13c,
        uVar4 = vector<crnlib::dxt_hc::alpha_cluster>::size
                          ((vector<crnlib::dxt_hc::alpha_cluster> *)&in_RDI[0x87].m_size),
        uVar21 < uVar4; local_13c = local_13c + 1) {
      paVar10 = vector<crnlib::dxt_hc::alpha_cluster>::operator[]
                          ((vector<crnlib::dxt_hc::alpha_cluster> *)&in_RDI[0x87].m_size,local_13c);
      uVar4 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&paVar10->pixels);
      if (uVar4 != 0) {
        paVar10 = vector<crnlib::dxt_hc::alpha_cluster>::operator[]
                            ((vector<crnlib::dxt_hc::alpha_cluster> *)&in_RDI[0x87].m_size,local_13c
                            );
        uVar4 = paVar10->first_endpoint;
        paVar10 = vector<crnlib::dxt_hc::alpha_cluster>::operator[]
                            ((vector<crnlib::dxt_hc::alpha_cluster> *)&in_RDI[0x87].m_size,local_13c
                            );
        local_140 = dxt5_block::pack_endpoints(uVar4,paVar10->second_endpoint);
        local_15c = vector<unsigned_int>::size(local_38);
        hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        ::insert((hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                  *)in_stack_fffffffffffffb38,
                 (uint *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 (uint *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        if ((local_148 & 1) == 0) {
          pvVar9 = hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                   ::iterator::operator->((iterator *)0x1ea722);
          uVar21 = pvVar9->second;
          puVar8 = vector<unsigned_short>::operator[]
                             ((vector<unsigned_short> *)&stack0xfffffffffffffee8,local_13c);
          *puVar8 = (unsigned_short)uVar21;
        }
        else {
          uVar4 = vector<unsigned_int>::size(local_38);
          puVar8 = vector<unsigned_short>::operator[]
                             ((vector<unsigned_short> *)&stack0xfffffffffffffee8,local_13c);
          *puVar8 = (unsigned_short)uVar4;
          vector<unsigned_int>::push_back
                    ((vector<unsigned_int> *)in_stack_fffffffffffffb20,
                     (uint *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
        }
      }
    }
    vector<unsigned_int>::size(in_stack_00000008);
    vector<unsigned_int>::size((vector<unsigned_int> *)&in_RDI[0x69].m_size);
    vector<unsigned_int>::reserve
              ((vector<unsigned_int> *)in_stack_fffffffffffffb50,
               (uint)((ulong)in_stack_fffffffffffffb48 >> 0x20));
    vector<unsigned_int>::size((vector<unsigned_int> *)&in_RDI[0x69].m_size);
    vector<unsigned_short>::vector
              ((vector<unsigned_short> *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::hash_map((hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                *)in_stack_fffffffffffffb20);
    local_194 = 0;
    while( true ) {
      uVar21 = local_194;
      uVar4 = vector<unsigned_int>::size((vector<unsigned_int> *)&in_RDI[0x69].m_size);
      new_capacity = (uint)((ulong)in_stack_fffffffffffffb48 >> 0x20);
      if (uVar4 <= uVar21) break;
      pbVar11 = vector<bool>::operator[]((vector<bool> *)&in_RDI[0x6b].m_size,local_194);
      if ((*pbVar11 & 1U) != 0) {
        vector<unsigned_int>::operator[]((vector<unsigned_int> *)&in_RDI[0x69].m_size,local_194);
        local_1b4 = vector<unsigned_int>::size(in_stack_00000008);
        hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        ::insert((hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                  *)in_stack_fffffffffffffb38,
                 (uint *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 (uint *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        if ((local_1a0 & 1) == 0) {
          pvVar9 = hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                   ::iterator::operator->((iterator *)0x1eaa0d);
          uVar21 = pvVar9->second;
          puVar8 = vector<unsigned_short>::operator[](&local_170,local_194);
          *puVar8 = (unsigned_short)uVar21;
        }
        else {
          uVar4 = vector<unsigned_int>::size(in_stack_00000008);
          puVar8 = vector<unsigned_short>::operator[](&local_170,local_194);
          *puVar8 = (unsigned_short)uVar4;
          vector<unsigned_int>::operator[]((vector<unsigned_int> *)&in_RDI[0x69].m_size,local_194);
          vector<unsigned_int>::push_back
                    ((vector<unsigned_int> *)in_stack_fffffffffffffb20,
                     (uint *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
        }
      }
      local_194 = local_194 + 1;
    }
    vector<unsigned_long_long>::size(in_stack_00000010);
    vector<unsigned_long_long>::size((vector<unsigned_long_long> *)&in_RDI[0x6a].m_size);
    vector<unsigned_long_long>::reserve
              ((vector<unsigned_long_long> *)in_stack_fffffffffffffb50,new_capacity);
    vector<unsigned_long_long>::size((vector<unsigned_long_long> *)&in_RDI[0x6a].m_size);
    vector<unsigned_short>::vector
              ((vector<unsigned_short> *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
    ::hash_map((hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
                *)in_stack_fffffffffffffb20);
    for (local_1ec = 0;
        uVar4 = vector<unsigned_long_long>::size((vector<unsigned_long_long> *)&in_RDI[0x6a].m_size)
        , local_1ec < uVar4; local_1ec = local_1ec + 1) {
      pbVar11 = vector<bool>::operator[]((vector<bool> *)&in_RDI[0x6c].m_size,local_1ec);
      if ((*pbVar11 & 1U) != 0) {
        vector<unsigned_long_long>::operator[]
                  ((vector<unsigned_long_long> *)&in_RDI[0x6a].m_size,local_1ec);
        vector<unsigned_long_long>::size(in_stack_00000010);
        hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
        ::insert(in_stack_fffffffffffffb38,
                 (unsigned_long_long *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30)
                 ,(uint *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        if ((local_1f8 & 1) == 0) {
          pvVar12 = hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
                    ::iterator::operator->((iterator *)0x1ead05);
          uVar21 = pvVar12->second;
          puVar8 = vector<unsigned_short>::operator[](&local_1c8,local_1ec);
          *puVar8 = (unsigned_short)uVar21;
        }
        else {
          uVar4 = vector<unsigned_long_long>::size(in_stack_00000010);
          puVar8 = vector<unsigned_short>::operator[](&local_1c8,local_1ec);
          *puVar8 = (unsigned_short)uVar4;
          vector<unsigned_long_long>::operator[]
                    ((vector<unsigned_long_long> *)&in_RDI[0x6a].m_size,local_1ec);
          vector<unsigned_long_long>::push_back
                    ((vector<unsigned_long_long> *)in_stack_fffffffffffffb20,
                     (unsigned_long_long *)
                     CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
        }
      }
    }
    vector<crnlib::dxt_hc::endpoint_indices_details>::resize
              ((vector<crnlib::dxt_hc::endpoint_indices_details> *)
               CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb2c,SUB41((uint)in_stack_fffffffffffffb28 >> 0x18,0));
    vector<crnlib::dxt_hc::selector_indices_details>::resize
              ((vector<crnlib::dxt_hc::selector_indices_details> *)
               CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb2c,SUB41((uint)in_stack_fffffffffffffb28 >> 0x18,0));
    for (local_210 = 0; local_210 < *(uint *)((long)in_stack_00000018 + 4);
        local_210 = local_210 + 1) {
      local_224 = *(uint *)((long)in_stack_00000018 + (ulong)local_210 * 0x10 + 0xc);
      uVar20 = local_224 + *(int *)((long)in_stack_00000018 + (ulong)local_210 * 0x10 + 0x10);
      uVar21 = *(uint *)((long)in_stack_00000018 + (ulong)local_210 * 0x10 + 0x14);
      local_220 = 0;
      while (local_224 < uVar20) {
        for (local_228 = 0; local_228 < uVar21; local_228 = local_228 + 1) {
          bVar15 = local_220 != 0;
          local_423 = bVar15 || local_228 != 0;
          bVar16 = false;
          if ((((ulong)in_RDI[0x86].m_p & 0x1000000000000) != 0) && (bVar16 = false, bVar15)) {
            bVar16 = local_228 != 0;
          }
          for (local_230 = (uint)(((ulong)in_RDI[0x86].m_p & 0x100000000) == 0);
              local_230 < *(int *)&in_RDI[0x86].m_p + 1U; local_230 = local_230 + 1) {
            if (local_230 == 0) {
              local_430 = &local_b0;
            }
            else {
              local_430 = (vector<unsigned_short> *)&stack0xfffffffffffffee8;
            }
            peVar13 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                                ((vector<crnlib::dxt_hc::endpoint_indices_details> *)
                                 &in_RDI[0x6e].m_size,local_224);
            puVar8 = vector<unsigned_short>::operator[]
                               (local_430,(uint)(peVar13->field_0).component[local_230]);
            uVar19 = *puVar8;
            bVar3 = false;
            if (local_423) {
              peVar13 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                                  (local_20,local_224 - 1);
              bVar3 = uVar19 == (peVar13->field_0).component[local_230];
            }
            local_423 = bVar3;
            bVar3 = false;
            if (bVar15) {
              peVar13 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                                  (local_20,local_224 - uVar21);
              bVar3 = uVar19 == (peVar13->field_0).component[local_230];
            }
            bVar15 = bVar3;
            bVar3 = false;
            if (bVar16) {
              peVar13 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                                  (local_20,~uVar21 + local_224);
              bVar3 = uVar19 == (peVar13->field_0).component[local_230];
            }
            bVar16 = bVar3;
            peVar13 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                                (local_20,local_224);
            (peVar13->field_0).component[local_230] = uVar19;
            if (local_230 == 0) {
              local_498 = &local_170;
            }
            else {
              local_498 = &local_1c8;
            }
            psVar14 = vector<crnlib::dxt_hc::selector_indices_details>::operator[]
                                ((vector<crnlib::dxt_hc::selector_indices_details> *)
                                 &in_RDI[0x6f].m_size,local_224);
            puVar8 = vector<unsigned_short>::operator[]
                               (local_498,(uint)(psVar14->field_0).component[local_230]);
            uVar19 = *puVar8;
            psVar14 = vector<crnlib::dxt_hc::selector_indices_details>::operator[]
                                (local_28,local_224);
            (psVar14->field_0).component[local_230] = uVar19;
          }
          if ((((ulong)in_RDI[0x86].m_p & 0x1000000000000) == 0) || ((local_224 & 1) == 0)) {
            if (local_423) {
              uVar18 = '\x01';
            }
            else if (bVar15) {
              uVar18 = '\x02';
            }
            else {
              uVar18 = '\0';
              if (bVar16) {
                uVar18 = '\x03';
              }
            }
          }
          else {
            peVar13 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                                ((vector<crnlib::dxt_hc::endpoint_indices_details> *)
                                 &in_RDI[0x6e].m_size,local_224);
            uVar18 = peVar13->reference;
          }
          in_stack_fffffffffffffb20 =
               (dxt_hc *)
               vector<crnlib::dxt_hc::endpoint_indices_details>::operator[](local_20,local_224);
          *(uint8 *)((anon_union_6_2_7fbd2915_for_endpoint_indices_details_0 *)
                     &in_stack_fffffffffffffb20->m_tiles + 1) = uVar18;
          local_224 = local_224 + 1;
        }
        local_220 = local_220 + 1;
      }
    }
    in_RDI[0x89].m_size = 0;
    in_RDI[0x89].m_capacity = 0;
    local_1 = 1;
    hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
    ::~hash_map((hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
                 *)in_stack_fffffffffffffb20);
    vector<unsigned_short>::~vector((vector<unsigned_short> *)in_stack_fffffffffffffb20);
    hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::~hash_map((hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                 *)in_stack_fffffffffffffb20);
    vector<unsigned_short>::~vector((vector<unsigned_short> *)in_stack_fffffffffffffb20);
    hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::~hash_map((hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                 *)in_stack_fffffffffffffb20);
    vector<unsigned_short>::~vector((vector<unsigned_short> *)in_stack_fffffffffffffb20);
    hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::~hash_map((hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                 *)in_stack_fffffffffffffb20);
    vector<unsigned_short>::~vector((vector<unsigned_short> *)in_stack_fffffffffffffb20);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool dxt_hc::compress(
    color_quad_u8 (*blocks)[16],
    crnlib::vector<endpoint_indices_details>& endpoint_indices,
    crnlib::vector<selector_indices_details>& selector_indices,
    crnlib::vector<uint32>& color_endpoints,
    crnlib::vector<uint32>& alpha_endpoints,
    crnlib::vector<uint32>& color_selectors,
    crnlib::vector<uint64>& alpha_selectors,
    const params& p
  ) {
  clear();
  m_has_etc_color_blocks = p.m_format == cETC1 || p.m_format == cETC2 || p.m_format == cETC2A || p.m_format == cETC1S || p.m_format == cETC2AS;
  m_has_subblocks = p.m_format == cETC1 || p.m_format == cETC2 || p.m_format == cETC2A;
  m_has_color_blocks = p.m_format == cDXT1 || p.m_format == cDXT5 || m_has_etc_color_blocks;
  m_num_alpha_blocks = p.m_format == cDXT5 || p.m_format == cDXT5A || p.m_format == cETC2A || p.m_format == cETC2AS ? 1 : p.m_format == cDXN_XY || p.m_format == cDXN_YX ? 2 : 0;
  if (!m_has_color_blocks && !m_num_alpha_blocks)
    return false;
  m_blocks = blocks;
  m_main_thread_id = crn_get_current_thread_id();
  m_pTask_pool = p.m_pTask_pool;
  m_params = p;

  uint tile_derating[8] = {0, 1, 1, 2, 2, 2, 2, 3};
  for (uint level = 0; level < p.m_num_levels; level++) {
    float adaptive_tile_color_psnr_derating = p.m_adaptive_tile_color_psnr_derating;
    if (level && adaptive_tile_color_psnr_derating > .25f)
      adaptive_tile_color_psnr_derating = math::maximum(.25f, adaptive_tile_color_psnr_derating / powf(3.0f, static_cast<float>(level)));
    for (uint e = 0; e < 8; e++)
      m_color_derating[level][e] = math::lerp(0.0f, adaptive_tile_color_psnr_derating, tile_derating[e] / 3.0f);
  }
  for (uint e = 0; e < 8; e++)
    m_alpha_derating[e] = math::lerp(0.0f, m_params.m_adaptive_tile_alpha_psnr_derating, tile_derating[e] / 3.0f);
  for (uint i = 0; i < 256; i++)
    m_uint8_to_float[i] = i * 1.0f / 255.0f;

  m_num_blocks = m_params.m_num_blocks;
  m_block_weights.resize(m_num_blocks);
  m_block_encodings.resize(m_num_blocks);
  for (uint c = 0; c < 3; c++)
    m_block_selectors[c].resize(m_num_blocks);
  m_tile_indices.resize(m_num_blocks);
  m_endpoint_indices.resize(m_num_blocks);
  m_selector_indices.resize(m_num_blocks);
  m_tiles.resize(m_num_blocks);

  for (uint level = 0; level < p.m_num_levels; level++) {
    float weight = p.m_levels[level].m_weight;
    for (uint b = p.m_levels[level].m_first_block, bEnd = b + p.m_levels[level].m_num_blocks; b < bEnd; b++)
      m_block_weights[b] = weight;
  }

  for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
    m_pTask_pool->queue_object_task(this, m_has_subblocks ? &dxt_hc::determine_tiles_task_etc : &dxt_hc::determine_tiles_task, i);
  m_pTask_pool->join();

  m_num_tiles = 0;
  for (uint t = 0; t < m_tiles.size(); t++) {
    if (m_tiles[t].pixels.size())
      m_num_tiles++;
  }

  if (m_has_color_blocks)
    determine_color_endpoints();

  if (m_num_alpha_blocks)
    determine_alpha_endpoints();

  if (m_has_color_blocks)
    create_color_selector_codebook();

  if (m_num_alpha_blocks)
    create_alpha_selector_codebook();

  color_endpoints.reserve(color_endpoints.size() + m_color_clusters.size());
  crnlib::vector<uint16> color_endpoints_remap(m_color_clusters.size());
  hash_map<uint32, uint> color_endpoints_map;
  for (uint i = 0; i < m_color_clusters.size(); i++) {
    if (m_color_clusters[i].pixels.size()) {
      uint32 endpoint = m_has_etc_color_blocks ? m_color_clusters[i].first_endpoint :
        dxt1_block::pack_endpoints(m_color_clusters[i].first_endpoint, m_color_clusters[i].second_endpoint);
      hash_map<uint32, uint>::insert_result insert_result = color_endpoints_map.insert(endpoint, color_endpoints.size());
      if (insert_result.second) {
        color_endpoints_remap[i] = color_endpoints.size();
        color_endpoints.push_back(endpoint);
      } else {
        color_endpoints_remap[i] = insert_result.first->second;
      }
    }
  }

  alpha_endpoints.reserve(alpha_endpoints.size() + m_alpha_clusters.size());
  crnlib::vector<uint16> alpha_endpoints_remap(m_alpha_clusters.size());
  hash_map<uint32, uint> alpha_endpoints_map;
  for (uint i = 0; i < m_alpha_clusters.size(); i++) {
    if (m_alpha_clusters[i].pixels.size()) {
      uint32 endpoint = dxt5_block::pack_endpoints(m_alpha_clusters[i].first_endpoint, m_alpha_clusters[i].second_endpoint);
      hash_map<uint32, uint>::insert_result insert_result = alpha_endpoints_map.insert(endpoint, alpha_endpoints.size());
      if (insert_result.second) {
        alpha_endpoints_remap[i] = alpha_endpoints.size();
        alpha_endpoints.push_back(endpoint);
      } else {
        alpha_endpoints_remap[i] = insert_result.first->second;
      }
    }
  }

  color_selectors.reserve(color_selectors.size() + m_color_selectors.size());
  crnlib::vector<uint16> color_selectors_remap(m_color_selectors.size());
  hash_map<uint32, uint> color_selectors_map;
  for (uint i = 0; i < m_color_selectors.size(); i++) {
    if (m_color_selectors_used[i]) {
      hash_map<uint32, uint>::insert_result insert_result = color_selectors_map.insert(m_color_selectors[i], color_selectors.size());
      if (insert_result.second) {
        color_selectors_remap[i] = color_selectors.size();
        color_selectors.push_back(m_color_selectors[i]);
      } else {
        color_selectors_remap[i] = insert_result.first->second;
      }
    }
  }

  alpha_selectors.reserve(alpha_selectors.size() + m_alpha_selectors.size());
  crnlib::vector<uint16> alpha_selectors_remap(m_alpha_selectors.size());
  hash_map<uint64, uint> alpha_selectors_map;
  for (uint i = 0; i < m_alpha_selectors.size(); i++) {
    if (m_alpha_selectors_used[i]) {
      hash_map<uint64, uint>::insert_result insert_result = alpha_selectors_map.insert(m_alpha_selectors[i], alpha_selectors.size());
      if (insert_result.second) {
        alpha_selectors_remap[i] = alpha_selectors.size();
        alpha_selectors.push_back(m_alpha_selectors[i]);
      } else {
        alpha_selectors_remap[i] = insert_result.first->second;
      }
    }
  }

  endpoint_indices.resize(m_num_blocks);
  selector_indices.resize(m_num_blocks);
  for (uint level = 0; level < p.m_num_levels; level++) {
    uint first_block = p.m_levels[level].m_first_block;
    uint end_block = first_block + p.m_levels[level].m_num_blocks;
    uint block_width = p.m_levels[level].m_block_width;
    for (uint by = 0, b = first_block; b < end_block; by++) {
      for (uint bx = 0; bx < block_width; bx++, b++) {
        bool top_match = by != 0;
        bool left_match = top_match || bx;
        bool diag_match = m_has_subblocks && top_match && bx;
        for (uint c = m_has_color_blocks ? 0 : cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++) {
          uint16 endpoint_index = (c ? alpha_endpoints_remap : color_endpoints_remap)[m_endpoint_indices[b].component[c]];
          left_match = left_match && endpoint_index == endpoint_indices[b - 1].component[c];
          top_match = top_match && endpoint_index == endpoint_indices[b - block_width].component[c];
          diag_match = diag_match && endpoint_index == endpoint_indices[b - block_width - 1].component[c];
          endpoint_indices[b].component[c] = endpoint_index;
          uint16 selector_index = (c ? alpha_selectors_remap : color_selectors_remap)[m_selector_indices[b].component[c]];
          selector_indices[b].component[c] = selector_index;
        }
        endpoint_indices[b].reference = m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : left_match ? 1 : top_match ? 2 : diag_match ? 3 : 0;
      }
    }
  }

  m_pTask_pool = NULL;
  return true;
}